

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_compiled.cpp
# Opt level: O1

void __thiscall
randomx::CompiledVm<randomx::LargePageAllocator,_true,_true>::run
          (CompiledVm<randomx::LargePageAllocator,_true,_true> *this,void *seed)

{
  JitCompiler *this_00;
  
  VmBase<randomx::LargePageAllocator,_true>::generateProgram
            ((VmBase<randomx::LargePageAllocator,_true> *)this,seed);
  randomx_vm::initialize((randomx_vm *)this);
  this_00 = &this->compiler;
  JitCompilerX86::enableWriting(this_00);
  JitCompilerX86::generateProgram
            (this_00,(Program *)&this->field_0x40,(ProgramConfiguration *)&this->field_0xbc0);
  JitCompilerX86::enableExecution(this_00);
  *(long *)&this->field_0xbe8 = **(long **)&this->field_0xbf8 + *(long *)&this->field_0xc00;
  (*(code *)(this->compiler).code)
            (&this->field_0xac0,&this->field_0xbe0,*(undefined8 *)&this->field_0xbf0,0x800);
  return;
}

Assistant:

void CompiledVm<Allocator, softAes, secureJit>::run(void* seed) {
		VmBase<Allocator, softAes>::generateProgram(seed);
		randomx_vm::initialize();
		if (secureJit) {
			compiler.enableWriting();
		}
		compiler.generateProgram(program, config);
		if (secureJit) {
			compiler.enableExecution();
		}
		mem.memory = datasetPtr->memory + datasetOffset;
		execute();
	}